

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer_tests.cc
# Opt level: O3

void __thiscall
lf::io::test::lf_io_VtkWriter_twoElementMeshCodim0AllData_Test::
~lf_io_VtkWriter_twoElementMeshCodim0AllData_Test
          (lf_io_VtkWriter_twoElementMeshCodim0AllData_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(lf_io_VtkWriter, twoElementMeshCodim0AllData) {
  auto reader = test_utils::getGmshReader("two_element_hybrid_2d.msh", 2);

  // write mesh:
  VtkWriter writer(reader.mesh(), "two_element.vtk");
  writer.setBinary(true);

  writer.WriteGlobalData("global_zeros", std::vector<int>{0, 0, 0});
  writer.WriteGlobalData("global_ones", std::vector<double>{1., 1., 1.});
  writer.WriteGlobalData("global_twos", std::vector<float>{2., 2., 2.});

  auto zero = Eigen::VectorXd::Zero(0);
  auto zero2 = Eigen::Vector2d::Zero();

  writer.WritePointData(
      "uchar", MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
        return static_cast<unsigned char>(reader.mesh()->Index(e));
      }));
  writer.WritePointData(
      "uchar_mf",
      MeshFunctionLambda([&](const auto& e, const Eigen::MatrixXd& x) {
        return static_cast<unsigned char>(reader.mesh()->Index(e));
      }));
  writer.WritePointData(
      "char", MakeMDSFromLambda(
                  reader.mesh(), 2,
                  [&](const auto& e) {
                    return static_cast<char>(reader.mesh()->Index(e));
                  },
                  [&](const auto& e) { return reader.mesh()->Index(e) < 3; }));
  writer.WritePointData(
      "char_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WritePointData(
      "uint", MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WritePointData(
      "uint_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WritePointData("int",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return static_cast<int>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("int_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return static_cast<int>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("float",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return static_cast<float>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("float_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return static_cast<float>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("double",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return static_cast<double>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("double_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return static_cast<double>(reader.mesh()->Index(e));
                        }));
  writer.WritePointData("vector2d",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return Eigen::Vector2d(e.Geometry()->Global(zero));
                        }));
  writer.WritePointData("vector2d_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return Eigen::Vector2d(e.Geometry()->Global(zero));
                        }));
  writer.WritePointData(
      "vector2f", MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
        return Eigen::Vector2f(
            e.Geometry()->Global(zero).template cast<float>());
      }));
  writer.WritePointData(
      "vector2f_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return Eigen::Vector2f(
            e.Geometry()->Global(zero).template cast<float>());
      }));
  writer.WritePointData("vector3d",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return Eigen::Vector3d(0, 1, 2);
                        }));
  writer.WritePointData("vector3d_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return Eigen::Vector3d(0, 1, 2);
                        }));
  writer.WritePointData("vector3f",
                        MakeMDSFromLambda(reader.mesh(), 2, [&](const auto& e) {
                          return Eigen::Vector3f{0, 1, 2};
                        }));
  writer.WritePointData("vector3f_mf",
                        MeshFunctionLambda([&](const auto& e, const auto& x) {
                          return Eigen::Vector3f(0, 1, 2);
                        }));

  writer.WritePointData(
      "vectorXd", MakeMDSFromLambda(reader.mesh(), 2,
                                    [&](const auto& e) -> Eigen::VectorXd {
                                      return Eigen::Vector2d(0, 1);
                                    }));
  writer.WritePointData(
      "vectorXd_mf",
      MeshFunctionLambda([&](const auto& e, const auto& x) -> Eigen::VectorXd {
        return Eigen::Vector2d(0, 1);
      }));
  writer.WritePointData(
      "vectorXf", MakeMDSFromLambda(reader.mesh(), 2,
                                    [&](const auto& e) -> Eigen::VectorXf {
                                      return Eigen::Vector2f{0, 1};
                                    }));
  writer.WritePointData(
      "vectorXf_mf",
      MeshFunctionLambda([&](const auto& e, const auto& x) -> Eigen::VectorXf {
        return Eigen::Vector2f(0, 1);
      }));

  writer.WriteCellData(
      "uchar", MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
        return static_cast<unsigned char>(reader.mesh()->Index(e));
      }));
  writer.WriteCellData(
      "uchar_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return static_cast<unsigned char>(reader.mesh()->Index(e));
      }));
  writer.WriteCellData(
      "char", MakeMDSFromLambda(
                  reader.mesh(), 0,
                  [&](const auto& e) {
                    return static_cast<char>(reader.mesh()->Index(e));
                  },
                  [&](const auto& e) { return reader.mesh()->Index(e) == 0; }));
  writer.WriteCellData(
      "uint", MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WriteCellData(
      "uint_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WriteCellData("int",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return static_cast<int>(reader.mesh()->Index(e));
                       }));
  writer.WriteCellData("int_mf",
                       MeshFunctionLambda([&](const auto& e, const auto& x) {
                         return static_cast<int>(reader.mesh()->Index(e));
                       }));
  writer.WriteCellData("float",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return static_cast<float>(reader.mesh()->Index(e));
                       }));
  writer.WriteCellData("float_mf",
                       MeshFunctionLambda([&](const auto& e, const auto& x) {
                         return static_cast<float>(reader.mesh()->Index(e));
                       }));
  writer.WriteCellData("double",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return static_cast<double>(reader.mesh()->Index(e));
                       }));
  writer.WriteCellData(
      "double_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return static_cast<unsigned int>(reader.mesh()->Index(e));
      }));
  writer.WriteCellData("vector2d",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return Eigen::Vector2d(e.Geometry()->Global(zero2));
                       }));
  writer.WriteCellData("vector2d_mf",
                       MeshFunctionLambda([&](const auto& e, const auto& x) {
                         return Eigen::Vector2d(e.Geometry()->Global(zero2));
                       }));
  writer.WriteCellData(
      "vector2f", MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
        return Eigen::Vector2f(
            e.Geometry()->Global(zero2).template cast<float>());
      }));
  writer.WriteCellData(
      "vector2f_mf", MeshFunctionLambda([&](const auto& e, const auto& x) {
        return Eigen::Vector2f(
            e.Geometry()->Global(zero2).template cast<float>());
      }));
  writer.WriteCellData("vector3d",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return Eigen::Vector3d(0, 1, 2);
                       }));
  writer.WriteCellData("vector3d_mf",
                       MeshFunctionLambda([&](const auto& e, const auto& x) {
                         return Eigen::Vector3d(0, 1, 2);
                       }));
  writer.WriteCellData("vector3f",
                       MakeMDSFromLambda(reader.mesh(), 0, [&](const auto& e) {
                         return Eigen::Vector3f{0, 1, 2};
                       }));
  writer.WriteCellData("vector3f_mf",
                       MeshFunctionLambda([&](const auto& e, const auto& x) {
                         return Eigen::Vector3f{0, 1, 2};
                       }));
  writer.WriteCellData("vectorXd",
                       MakeMDSFromLambda(reader.mesh(), 0,
                                         [&](const auto& e) -> Eigen::VectorXd {
                                           return Eigen::Vector3d(0, 1, 2);
                                         }));
  writer.WriteCellData(
      "vectorXd_mf",
      MeshFunctionLambda([&](const auto& e, const auto& x) -> Eigen::VectorXd {
        return Eigen::Vector3d(0, 1, 2);
      }));

  writer.WriteCellData("vectorXf",
                       MakeMDSFromLambda(reader.mesh(), 0,
                                         [&](const auto& e) -> Eigen::VectorXf {
                                           return Eigen::Vector3f(0, 1, 2);
                                         }));
  writer.WriteCellData(
      "vectorXf_mf",
      MeshFunctionLambda([&](const auto& e, const auto& x) -> Eigen::VectorXf {
        return Eigen::Vector3f(0, 1, 2);
      }));

  // try to write data with a name that is already used:
  EXPECT_THROW(writer.WritePointData(
                   "char", MakeMDSFromLambda(reader.mesh(), 2,
                                             [](const auto& e) { return 1; })),
               base::LfException);
  EXPECT_THROW(writer.WriteCellData(
                   "char", MakeMDSFromLambda(reader.mesh(), 0,
                                             [](const auto& e) { return 1; })),
               base::LfException);
  EXPECT_THROW(writer.WriteGlobalData("global_zeros", std::vector<int>{0}),
               base::LfException);

  // try to write data with a name that contains spaces:
  EXPECT_THROW(writer.WritePointData(
                   "h w", MakeMDSFromLambda(reader.mesh(), 2,
                                            [](const auto& e) { return 1; })),
               base::LfException);
  EXPECT_THROW(writer.WriteCellData(
                   "h w", MakeMDSFromLambda(reader.mesh(), 0,
                                            [](const auto& e) { return 1; })),
               base::LfException);
  EXPECT_THROW(writer.WriteGlobalData("h w", std::vector<int>{0}),
               base::LfException);
}